

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

bool Js::JavascriptConversion::SameValueCommon<false>(Var aLeft,Var aRight)

{
  uint32 uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int32 iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptString *aLeft_00;
  JavascriptString *aRight_00;
  JavascriptSymbol *pJVar8;
  JavascriptSymbol *pJVar9;
  JavascriptTypedNumber<long> *pJVar10;
  JavascriptTypedNumber<unsigned_long> *pJVar11;
  uint32 *puVar12;
  Type TVar13;
  Type TVar14;
  Type typeId;
  double local_40;
  double dblLeft;
  double dblRight;
  
  if (aLeft == aRight) {
    return true;
  }
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9df8e;
    *puVar6 = 0;
  }
  if (((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a9df8e;
    *puVar6 = 0;
  }
  typeId = TypeIds_FirstNumberType;
  if ((((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) &&
     (typeId = TypeIds_Number, (ulong)aLeft >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a9df8e;
      *puVar6 = 0;
    }
    typeId = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00a9df8e;
      *puVar6 = 0;
    }
  }
  BVar4 = JavascriptOperators::IsUndefinedOrNullType(typeId);
  if (BVar4 != 0) {
    return false;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9df8e;
    *puVar6 = 0;
  }
  if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a9df8e;
    *puVar6 = 0;
  }
  TVar13 = TypeIds_FirstNumberType;
  if ((((ulong)aRight & 0xffff000000000000) != 0x1000000000000) &&
     (TVar13 = TypeIds_Number, (ulong)aRight >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a9df8e;
      *puVar6 = 0;
    }
    TVar13 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar13) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00a9df8e;
      *puVar6 = 0;
    }
  }
  switch(typeId) {
  case TypeIds_FirstNumberType:
    if (TVar13 == TypeIds_LastNumberType) {
      iVar5 = TaggedInt::ToInt32(aLeft);
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(aRight);
LAB_00a9de2f:
      return pJVar10->m_value == (long)iVar5;
    }
    if (TVar13 == TypeIds_Int64Number) {
      iVar5 = TaggedInt::ToInt32(aLeft);
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      goto LAB_00a9de2f;
    }
    if (TVar13 != TypeIds_Number) {
      return false;
    }
    local_40 = (double)(int)aLeft;
    break;
  case TypeIds_Number:
    switch(TVar13) {
    case TypeIds_FirstNumberType:
      local_40 = JavascriptNumber::GetValue(aLeft);
      dblLeft = (double)(int)aRight;
      break;
    case TypeIds_Number:
      local_40 = JavascriptNumber::GetValue(aLeft);
      goto LAB_00a9df23;
    case TypeIds_Int64Number:
      local_40 = JavascriptNumber::GetValue(aLeft);
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      dblLeft = (double)pJVar10->m_value;
      break;
    case TypeIds_LastNumberType:
      local_40 = JavascriptNumber::GetValue(aLeft);
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      dblLeft = ((double)CONCAT44(0x43300000,(int)pJVar11->m_value) - 4503599627370496.0) +
                ((double)CONCAT44(0x45300000,(int)(pJVar11->m_value >> 0x20)) -
                1.9342813113834067e+25);
      break;
    default:
      goto switchD_00a9dc98_default;
    }
    goto LAB_00a9df30;
  case TypeIds_Int64Number:
    switch(TVar13) {
    case TypeIds_FirstNumberType:
      pJVar11 = (JavascriptTypedNumber<unsigned_long> *)
                UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_00a9dd38:
      TVar14 = pJVar11->m_value;
      iVar5 = TaggedInt::ToInt32(aRight);
      return TVar14 == (long)iVar5;
    case TypeIds_Number:
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      local_40 = (double)pJVar10->m_value;
      break;
    case TypeIds_Int64Number:
      pJVar11 = (JavascriptTypedNumber<unsigned_long> *)
                UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_00a9de57:
      TVar14 = pJVar11->m_value;
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
LAB_00a9deb2:
      return TVar14 == pJVar10->m_value;
    case TypeIds_LastNumberType:
      pJVar11 = (JavascriptTypedNumber<unsigned_long> *)
                UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
LAB_00a9dea6:
      TVar14 = pJVar11->m_value;
      pJVar10 = VarTo<Js::JavascriptTypedNumber<long>>(aRight);
      goto LAB_00a9deb2;
    default:
      goto switchD_00a9dc98_default;
    }
    break;
  case TypeIds_LastNumberType:
    switch(TVar13) {
    case TypeIds_FirstNumberType:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      goto LAB_00a9dd38;
    case TypeIds_Number:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      local_40 = ((double)CONCAT44(0x43300000,(int)pJVar11->m_value) - 4503599627370496.0) +
                 ((double)CONCAT44(0x45300000,(int)(pJVar11->m_value >> 0x20)) -
                 1.9342813113834067e+25);
      break;
    case TypeIds_Int64Number:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      goto LAB_00a9de57;
    case TypeIds_LastNumberType:
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      goto LAB_00a9dea6;
    default:
      goto switchD_00a9dc98_default;
    }
    break;
  case TypeIds_String:
    if (TVar13 != TypeIds_String) {
      return false;
    }
    aLeft_00 = UnsafeVarTo<Js::JavascriptString>(aLeft);
    aRight_00 = UnsafeVarTo<Js::JavascriptString>(aRight);
    bVar3 = JavascriptString::Equals(aLeft_00,aRight_00);
    return bVar3;
  case TypeIds_Symbol:
    if (TVar13 == TypeIds_Symbol) {
      pJVar8 = UnsafeVarTo<Js::JavascriptSymbol>(aLeft);
      pJVar9 = UnsafeVarTo<Js::JavascriptSymbol>(aRight);
      if ((pJVar8->propertyRecordUsageCache).propertyRecord.ptr ==
          (pJVar9->propertyRecordUsageCache).propertyRecord.ptr) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                    ,0xd2,"(leftSymbol->GetValue() != rightSymbol->GetValue())",
                                    "leftSymbol->GetValue() != rightSymbol->GetValue()");
        if (!bVar3) {
LAB_00a9df8e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
  default:
    goto switchD_00a9dc98_default;
  }
LAB_00a9df23:
  dblLeft = JavascriptNumber::GetValue(aRight);
LAB_00a9df30:
  bVar3 = NumberUtilities::IsNan(local_40);
  if ((bVar3) && (bVar3 = NumberUtilities::IsNan(dblLeft), bVar3)) {
    return true;
  }
  puVar12 = NumberUtilities::LuLoDbl(&local_40);
  uVar1 = *puVar12;
  puVar12 = NumberUtilities::LuLoDbl(&dblLeft);
  if (uVar1 == *puVar12) {
    puVar12 = NumberUtilities::LuHiDbl(&local_40);
    uVar1 = *puVar12;
    puVar12 = NumberUtilities::LuHiDbl(&dblLeft);
    return uVar1 == *puVar12;
  }
switchD_00a9dc98_default:
  return false;
}

Assistant:

bool JavascriptConversion::SameValueCommon(Var aLeft, Var aRight)
    {
        if (aLeft == aRight)
        {
            return true;
        }

        TypeId leftType = JavascriptOperators::GetTypeId(aLeft);

        if (JavascriptOperators::IsUndefinedOrNullType(leftType))
        {
            return false;
        }

        TypeId rightType = JavascriptOperators::GetTypeId(aRight);
        double dblLeft, dblRight;

        switch (leftType)
        {
        case TypeIds_Integer:
            switch (rightType)
            {
            case TypeIds_Integer:
                return false;
            case TypeIds_Number:
                dblLeft     = TaggedInt::ToDouble(aLeft);
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                int leftValue = TaggedInt::ToInt32(aLeft);
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            case TypeIds_UInt64Number:
                {
                int leftValue = TaggedInt::ToInt32(aLeft);
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            }
            break;
        case TypeIds_Int64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                int rightValue = TaggedInt::ToInt32(aRight);
                return leftValue == rightValue;
                }
            case TypeIds_Number:
                dblLeft     = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            case TypeIds_UInt64Number:
                {
                __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return ((unsigned __int64)leftValue == rightValue);
                }
            }
            break;
        case TypeIds_UInt64Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = TaggedInt::ToInt32(aRight);
                return (leftValue == (unsigned __int64)rightValue);
                }
            case TypeIds_Number:
                dblLeft     = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight    = JavascriptNumber::GetValue(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                return (leftValue == (unsigned __int64)rightValue);
                }
            case TypeIds_UInt64Number:
                {
                unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                unsigned __int64 rightValue = VarTo<JavascriptInt64Number>(aRight)->GetValue();
                return leftValue == rightValue;
                }
            }
            break;
        case TypeIds_Number:
            switch (rightType)
            {
            case TypeIds_Integer:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = TaggedInt::ToDouble(aRight);
                goto CommonNumber;
            case TypeIds_Int64Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = (double)UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_UInt64Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = (double)UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                goto CommonNumber;
            case TypeIds_Number:
                dblLeft     = JavascriptNumber::GetValue(aLeft);
                dblRight    = JavascriptNumber::GetValue(aRight);
CommonNumber:
                if (JavascriptNumber::IsNan(dblLeft) && JavascriptNumber::IsNan(dblRight))
                {
                    return true;
                }

                if (zero)
                {
                    // SameValueZero(+0,-0) returns true;
                    return dblLeft == dblRight;
                }
                else
                {
                    // SameValue(+0,-0) returns false;
                    return (NumberUtilities::LuLoDbl(dblLeft) == NumberUtilities::LuLoDbl(dblRight) &&
                        NumberUtilities::LuHiDbl(dblLeft) == NumberUtilities::LuHiDbl(dblRight));
                }
            }
            break;
        case TypeIds_Boolean:
            return false;
        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_String:
                return JavascriptString::Equals(UnsafeVarTo<JavascriptString>(aLeft), UnsafeVarTo<JavascriptString>(aRight));
            }
            break;
#if DBG
        case TypeIds_Symbol:
            if (rightType == TypeIds_Symbol)
            {
                JavascriptSymbol* leftSymbol = UnsafeVarTo<JavascriptSymbol>(aLeft);
                JavascriptSymbol* rightSymbol = UnsafeVarTo<JavascriptSymbol>(aRight);
                Assert(leftSymbol->GetValue() != rightSymbol->GetValue());
            }
#endif
        default:
            break;
        }
        return false;
    }